

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionModel.hpp
# Opt level: O0

VectorXf __thiscall
eos::morphablemodel::draw_sample
          (morphablemodel *this,ExpressionModel *expression_model,
          vector<float,_std::allocator<float>_> *expression_coefficients)

{
  PcaModel *coefficients;
  bool bVar1;
  VectorXf *other;
  size_type sVar2;
  const_reference pvVar3;
  Index IVar4;
  float *dataPtr;
  runtime_error *this_00;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index extraout_RDX_01;
  Index extraout_RDX_02;
  VectorXf VVar5;
  Stride<0,_0> local_c2;
  Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_c0;
  MatrixXf local_a8;
  Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
  local_90;
  vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
  *local_70;
  vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
  *expression_blendshapes;
  PcaModel *local_30;
  PcaModel *pca_expression_model;
  vector<float,_std::allocator<float>_> *local_20;
  vector<float,_std::allocator<float>_> *expression_coefficients_local;
  ExpressionModel *expression_model_local;
  VectorXf *expression_sample;
  
  pca_expression_model._7_1_ = 0;
  local_20 = expression_coefficients;
  expression_coefficients_local = (vector<float,_std::allocator<float>_> *)expression_model;
  expression_model_local = (ExpressionModel *)this;
  Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::Matrix((Matrix<float,__1,_1,_0,__1,_1> *)this);
  bVar1 = std::
          holds_alternative<eos::morphablemodel::PcaModel,eos::morphablemodel::PcaModel,std::vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>
                    ((variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>
                      *)expression_coefficients_local);
  if (bVar1) {
    local_30 = std::
               get<eos::morphablemodel::PcaModel,eos::morphablemodel::PcaModel,std::vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>
                         ((variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>
                           *)expression_coefficients_local);
    bVar1 = std::vector<float,_std::allocator<float>_>::empty(expression_coefficients);
    coefficients = local_30;
    if (bVar1) {
      other = PcaModel::get_mean(local_30);
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::operator=((Matrix<float,__1,_1,_0,__1,_1> *)this,other)
      ;
      IVar4 = extraout_RDX;
    }
    else {
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&expression_blendshapes,
                 expression_coefficients);
      PcaModel::draw_sample
                ((PcaModel *)&stack0xffffffffffffffb0,
                 (vector<float,_std::allocator<float>_> *)coefficients);
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::operator=
                ((Matrix<float,__1,_1,_0,__1,_1> *)this,
                 (Matrix<float,__1,_1,_0,__1,_1> *)&stack0xffffffffffffffb0);
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix
                ((Matrix<float,__1,_1,_0,__1,_1> *)&stack0xffffffffffffffb0);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)&expression_blendshapes);
      IVar4 = extraout_RDX_00;
    }
  }
  else {
    bVar1 = std::
            holds_alternative<std::vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>,eos::morphablemodel::PcaModel,std::vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>
                      ((variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>
                        *)expression_coefficients_local);
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,
                 "The given ExpressionModel doesn\'t contain an expression model in the form of a PcaModel or Blendshapes."
                );
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_70 = std::
               get<std::vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>,eos::morphablemodel::PcaModel,std::vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>
                         ((variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>
                           *)expression_coefficients_local);
    sVar2 = std::
            vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
            ::size(local_70);
    if (sVar2 == 0) {
      __assert_fail("expression_blendshapes.size() > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/morphablemodel/ExpressionModel.hpp"
                    ,0x49,
                    "Eigen::VectorXf eos::morphablemodel::draw_sample(const ExpressionModel &, std::vector<float>)"
                   );
    }
    bVar1 = std::vector<float,_std::allocator<float>_>::empty(expression_coefficients);
    if (bVar1) {
      pvVar3 = std::
               vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
               ::operator[](local_70,0);
      IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::rows
                        (&(pvVar3->deformation).
                          super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>);
      Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::setZero
                ((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)this,IVar4);
      IVar4 = extraout_RDX_01;
    }
    else {
      to_matrix(&local_a8,local_70);
      dataPtr = std::vector<float,_std::allocator<float>_>::data(expression_coefficients);
      sVar2 = std::vector<float,_std::allocator<float>_>::size(expression_coefficients);
      Eigen::Stride<0,_0>::Stride(&local_c2);
      Eigen::Map<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>::Map
                (&local_c0,dataPtr,sVar2,&local_c2);
      Eigen::MatrixBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::operator*
                (&local_90,(MatrixBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&local_a8,
                 (MatrixBase<Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&local_c0);
      Eigen::Matrix<float,-1,1,0,-1,1>::operator=
                ((Matrix<float,_1,1,0,_1,1> *)this,
                 (DenseBase<Eigen::Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                  *)&local_90);
      Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_a8);
      IVar4 = extraout_RDX_02;
    }
  }
  VVar5.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar4;
  VVar5.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (float *)this;
  return (VectorXf)VVar5.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

inline Eigen::VectorXf draw_sample(const ExpressionModel& expression_model,
                                   std::vector<float> expression_coefficients)
{
    Eigen::VectorXf expression_sample;
    // Get a sample of the expression model, depending on whether it's a PcaModel or Blendshapes:
    if (cpp17::holds_alternative<PcaModel>(expression_model))
    {
        const auto& pca_expression_model = cpp17::get<PcaModel>(expression_model);
        if (expression_coefficients.empty())
        {
            expression_sample = pca_expression_model.get_mean();
        } else
        {
            expression_sample = pca_expression_model.draw_sample(expression_coefficients);
        }
    } else if (cpp17::holds_alternative<Blendshapes>(expression_model))
    {
        const auto& expression_blendshapes = cpp17::get<Blendshapes>(expression_model);
        assert(expression_blendshapes.size() > 0);
        if (expression_coefficients.empty())
        {
            expression_sample.setZero(expression_blendshapes[0].deformation.rows());
        } else
        {
            expression_sample = to_matrix(expression_blendshapes) *
                                Eigen::Map<const Eigen::VectorXf>(expression_coefficients.data(),
                                                                  expression_coefficients.size());
        }
    } else
    {
        throw std::runtime_error("The given ExpressionModel doesn't contain an expression model in the form "
                                 "of a PcaModel or Blendshapes.");
    }
    return expression_sample;
}